

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objetosAcertaveis.h
# Opt level: O1

bool __thiscall
objetosAcertaveis::acerto(objetosAcertaveis *this,raio *raio,double tMin,double tMax,acerto *acerto)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<objetoAcertavel> *objeto;
  pointer psVar5;
  acerto acertoTemporario;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  
  local_58 = 0.0;
  uStack_50 = 0;
  uStack_4f = 0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  psVar5 = (this->objetos).
           super__Vector_base<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->objetos).
           super__Vector_base<std::shared_ptr<objetoAcertavel>,_std::allocator<std::shared_ptr<objetoAcertavel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar1) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    local_88 = tMax;
    do {
      peVar2 = (psVar5->super___shared_ptr<objetoAcertavel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (**peVar2->_vptr_objetoAcertavel)
                        (SUB84(tMin,0),SUB84(local_88,0),peVar2,raio,&local_78);
      if ((char)iVar3 != '\0') {
        local_88 = (double)CONCAT71(uStack_47,local_48);
        *(ulong *)((long)(acerto->normal).e + 0x11) = CONCAT17(local_48,uStack_4f);
        *(ulong *)((long)&acerto->t + 1) = CONCAT17(uStack_40,uStack_47);
        (acerto->normal).e[1] = local_58;
        (acerto->normal).e[2] = (double)CONCAT71(uStack_4f,uStack_50);
        (acerto->ponto).e[2] = local_68;
        (acerto->normal).e[0] = dStack_60;
        (acerto->ponto).e[0] = local_78;
        (acerto->ponto).e[1] = dStack_70;
        bVar4 = true;
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  return bVar4;
}

Assistant:

bool objetosAcertaveis::acerto(const raio &raio, double tMin, double tMax, struct acerto &acerto) const {
    struct acerto acertoTemporario;
    bool acertouAlgo = false;
    double acertoMaisProximo = tMax;

    for (const auto &objeto : objetos) {
        if (objeto->acerto(raio, tMin, acertoMaisProximo, acertoTemporario)) {
            acertouAlgo = true;
            acertoMaisProximo = acertoTemporario.t;
            acerto = acertoTemporario;
        }
    }

    return acertouAlgo;
}